

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O1

void predict_or_learn<true>(baseline *data,single_learner *base,example *ec)

{
  float fVar1;
  float *pfVar2;
  example *peVar3;
  shared_data *psVar4;
  float *pfVar5;
  unsigned_long *puVar6;
  float fVar7;
  float fVar8;
  
  if (data->check_enabled != true) {
LAB_002112d2:
    if (data->global_only == true) {
      if (data->global_initialized == false) {
        init_global(data);
        data->global_initialized = true;
      }
      VW::copy_example_metadata(false,data->ec,ec);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),data->ec)
      ;
      (ec->l).simple.initial = (data->ec->pred).scalar;
    }
    (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    fVar1 = (ec->pred).scalar;
    peVar3 = data->ec;
    (peVar3->l).simple.initial = (ec->l).simple.initial;
    (peVar3->l).multi = (ec->l).multi;
    if (data->global_only == false) {
      VW::copy_example_metadata(false,data->ec,ec);
      VW::move_feature_namespace(data->ec,ec,0x80);
    }
    if (data->lr_scaling == true) {
      fVar8 = data->lr_multiplier;
      if ((fVar8 == 0.0) && (!NAN(fVar8))) {
        psVar4 = data->all->sd;
        fVar7 = ABS(psVar4->min_label);
        fVar8 = ABS(psVar4->max_label);
        if (fVar8 <= fVar7) {
          fVar8 = fVar7;
        }
        if (fVar8 <= 0.0001) {
          fVar8 = 0.0001;
        }
        if (1000.0 < fVar8) {
          fVar8 = 1000.0;
        }
      }
      data->all->eta = data->all->eta * fVar8;
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),data->ec)
      ;
      data->all->eta = data->all->eta / fVar8;
    }
    else {
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),data->ec)
      ;
    }
    (ec->l).simple.initial = (data->ec->pred).scalar;
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    if (data->global_only == false) {
      VW::move_feature_namespace(ec,data->ec,0x80);
    }
    (ec->pred).scalar = fVar1;
    return;
  }
  pfVar5 = (ec->super_example_predict).feature_space[0x89].values._begin;
  pfVar2 = (ec->super_example_predict).feature_space[0x89].values._end;
  if (pfVar5 != pfVar2) {
    puVar6 = (ec->super_example_predict).feature_space[0x89].indicies._begin;
    do {
      if (*puVar6 == 0x54d) {
        if (*pfVar5 == 1.0) goto LAB_002112d2;
        break;
      }
      pfVar5 = pfVar5 + 1;
      puVar6 = puVar6 + 1;
    } while (pfVar5 != pfVar2);
  }
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  return;
}

Assistant:

void predict_or_learn(baseline& data, single_learner& base, example& ec)
{
  // no baseline if check_enabled is true and example contains flag
  if (data.check_enabled && !BASELINE::baseline_enabled(&ec))
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
    return;
  }

  // always do a full prediction, for safety in accurate predictive validation
  if (data.global_only)
  {
    if (!data.global_initialized)
    {
      init_global(data);
      data.global_initialized = true;
    }
    VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
    base.predict(*data.ec);
    ec.l.simple.initial = data.ec->pred.scalar;
    base.predict(ec);
  }
  else
    base.predict(ec);

  if (is_learn)
  {
    const float pred = ec.pred.scalar;  // save 'safe' prediction

    // now learn
    data.ec->l.simple = ec.l.simple;
    if (!data.global_only)
    {
      // move label & constant features data over to baseline example
      VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
      VW::move_feature_namespace(data.ec, &ec, constant_namespace);
    }

    // regress baseline on label
    if (data.lr_scaling)
    {
      float multiplier = data.lr_multiplier;
      if (multiplier == 0)
      {
        multiplier = max<float>(0.0001f, max<float>(abs(data.all->sd->min_label), abs(data.all->sd->max_label)));
        if (multiplier > max_multiplier)
          multiplier = max_multiplier;
      }
      data.all->eta *= multiplier;
      base.learn(*data.ec);
      data.all->eta /= multiplier;
    }
    else
      base.learn(*data.ec);

    // regress residual
    ec.l.simple.initial = data.ec->pred.scalar;
    base.learn(ec);

    if (!data.global_only)
    {
      // move feature data back to the original example
      VW::move_feature_namespace(&ec, data.ec, constant_namespace);
    }

    // return the safe prediction
    ec.pred.scalar = pred;
  }
}